

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O0

float __thiscall nv::KaiserFilter::evaluate(KaiserFilter *this,float x)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float t;
  float sinc_value;
  float x_local;
  KaiserFilter *this_local;
  
  fVar1 = anon_unknown.dwarf_469c36::sincf(x * 3.1415927 * this->stretch);
  fVar2 = x / (this->super_Filter).m_width;
  if (-fVar2 * fVar2 + 1.0 < 0.0) {
    this_local._4_4_ = 0.0;
  }
  else {
    fVar3 = *(float *)&(this->super_Filter).field_0xc;
    fVar2 = sqrtf_assert(-fVar2 * fVar2 + 1.0);
    fVar2 = anon_unknown.dwarf_469c36::bessel0(fVar3 * fVar2);
    fVar3 = anon_unknown.dwarf_469c36::bessel0(*(float *)&(this->super_Filter).field_0xc);
    this_local._4_4_ = (fVar1 * fVar2) / fVar3;
  }
  return this_local._4_4_;
}

Assistant:

float KaiserFilter::evaluate(float x) const
{
	const float sinc_value = sincf(PI * x * stretch);
	const float t = x / m_width;
	if ((1 - t * t) >= 0) return sinc_value * bessel0(alpha * sqrtf(1 - t * t)) / bessel0(alpha);
	else return 0;
}